

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::TemplatedWritePlain<int,int,duckdb::ParquetCastOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  idx_t iVar4;
  
  lVar2 = *(long *)(col + 0x20);
  if (chunk_start <= chunk_end && chunk_end - chunk_start != 0) {
    ser = (WriteStream *)(ulong)*(uint *)&stats[1]._vptr_ColumnWriterStatistics;
    uVar3 = *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4);
    iVar4 = chunk_start;
    do {
      uVar1 = *(uint *)(lVar2 + iVar4 * 4);
      if ((int)uVar1 < (int)ser) {
        *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar1;
        ser = (WriteStream *)(ulong)uVar1;
      }
      if ((int)uVar3 < (int)uVar1) {
        *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = uVar1;
        uVar3 = uVar1;
      }
      iVar4 = iVar4 + 1;
    } while (chunk_end != iVar4);
  }
  (*(code *)**(undefined8 **)mask)
            (mask,lVar2 + chunk_start * 4,(chunk_end - chunk_start) * 4,chunk_end,mask,ser);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}